

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
despot::Variable::ComputeIndexVec
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<despot::StateVar_*,_std::allocator<despot::StateVar_*>_> *vars,int index)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference ppSVar4;
  reference pvVar5;
  int local_30;
  int i;
  allocator<int> local_1e;
  undefined1 local_1d;
  int local_1c;
  vector<despot::StateVar_*,_std::allocator<despot::StateVar_*>_> *pvStack_18;
  int index_local;
  vector<despot::StateVar_*,_std::allocator<despot::StateVar_*>_> *vars_local;
  vector<int,_std::allocator<int>_> *vec;
  
  local_1d = 0;
  local_1c = index;
  pvStack_18 = vars;
  vars_local = (vector<despot::StateVar_*,_std::allocator<despot::StateVar_*>_> *)
               __return_storage_ptr__;
  sVar3 = std::vector<despot::StateVar_*,_std::allocator<despot::StateVar_*>_>::size(vars);
  std::allocator<int>::allocator(&local_1e);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,sVar3,&local_1e);
  std::allocator<int>::~allocator(&local_1e);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
  local_30 = (int)sVar3;
  while (iVar2 = local_1c, local_30 = local_30 + -1, -1 < local_30) {
    ppSVar4 = std::vector<despot::StateVar_*,_std::allocator<despot::StateVar_*>_>::operator[]
                        (pvStack_18,(long)local_30);
    iVar1 = Size((Variable *)*ppSVar4);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)local_30);
    *pvVar5 = iVar2 % iVar1;
    ppSVar4 = std::vector<despot::StateVar_*,_std::allocator<despot::StateVar_*>_>::operator[]
                        (pvStack_18,(long)local_30);
    iVar2 = Size((Variable *)*ppSVar4);
    local_1c = local_1c / iVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Variable::ComputeIndexVec(const vector<StateVar*>& vars,
	int index) {
	vector<int> vec(vars.size());
	for (int i = vec.size() - 1; i >= 0; i--) {
		vec[i] = index % vars[i]->Size();
		index /= vars[i]->Size();
	}

	return vec;
}